

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.cpp
# Opt level: O1

void __thiscall dg::llvmdg::SCD::computePostDominators(SCD *this,Function *F)

{
  Function *pFVar1;
  DomSetType *pDVar2;
  _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
  *p_Var3;
  _Rb_tree_node_base *p_Var4;
  DomTreeNode *Node;
  const_arg_type_t<llvm::BasicBlock_*> Val;
  const_iterator cVar5;
  BasicBlock *pdf;
  PostDominanceFrontiers PDF;
  PostDominatorTreeWrapperPass wrapper;
  const_arg_type_t<llvm::BasicBlock_*> local_110;
  unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
  *local_108;
  Function *local_100;
  Function *local_f8;
  _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_f0;
  BasicBlock *local_e8;
  _Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
  local_e0;
  code *local_b0 [4];
  undefined1 *local_90 [2];
  undefined1 local_80 [32];
  void *local_60 [2];
  uint local_50;
  
  llvm::PostDominatorTreeWrapperPass::PostDominatorTreeWrapperPass
            ((PostDominatorTreeWrapperPass *)local_b0);
  llvm::PostDominatorTreeWrapperPass::runOnFunction((Function *)local_b0);
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0._M_impl.super__Rb_tree_header._M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar1 = *(Function **)(F + 0x50);
  local_100 = F + 0x48;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pFVar1 != local_100) {
    local_f0 = (_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->dependentBlocks;
    local_108 = &this->dependencies;
    do {
      Val = (const_arg_type_t<llvm::BasicBlock_*>)(pFVar1 + -0x18);
      if (pFVar1 == (Function *)0x0) {
        Val = (const_arg_type_t<llvm::BasicBlock_*>)0x0;
      }
      local_f8 = pFVar1;
      cVar5 = llvm::
              DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
              ::find((DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                      *)local_60,Val);
      if (cVar5.Ptr == (pointer)((ulong)local_50 * 0x10 + (long)local_60[0])) {
        Node = (DomTreeNode *)0x0;
      }
      else {
        Node = ((cVar5.Ptr)->
               super_pair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>
               ).second._M_t.
               super___uniq_ptr_impl<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
               .super__Head_base<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_false>._M_head_impl
        ;
      }
      pDVar2 = PostDominanceFrontiers::calculate
                         ((PostDominanceFrontiers *)&local_e0,(PostDominatorTree *)local_90,Node);
      for (p_Var4 = (pDVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pDVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        local_e8 = *(BasicBlock **)(p_Var4 + 1);
        local_110 = Val;
        p_Var3 = (_Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
                  *)std::__detail::
                    _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->dependencies,&local_110);
        std::
        _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
        ::_M_insert_unique<llvm::BasicBlock*const&>(p_Var3,&local_e8);
        p_Var3 = (_Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
                  *)std::__detail::
                    _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_f0,&local_e8);
        local_110 = Val;
        std::
        _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
        ::_M_insert_unique<llvm::BasicBlock*>(p_Var3,&local_110);
      }
      pFVar1 = *(Function **)(local_f8 + 8);
    } while (pFVar1 != local_100);
  }
  std::
  _Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
  ::_M_erase(&local_e0,(_Link_type)local_e0._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_b0[0] = llvm::errs;
  llvm::
  DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
  ::destroyAll((DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                *)local_60);
  llvm::deallocate_buffer(local_60[0],(ulong)local_50 << 4,8);
  if (local_90[0] != local_80) {
    free(local_90[0]);
  }
  llvm::Pass::~Pass((Pass *)local_b0);
  return;
}

Assistant:

void SCD::computePostDominators(llvm::Function &F) {
    DBG_SECTION_BEGIN(cda, "Computing post dominators for function "
                                   << F.getName().str());
    using namespace llvm;

    PostDominatorTree *pdtree = nullptr;

    DBG(cda, "Computing post dominator tree");
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 9))

    auto pdtreeptr =
            std::unique_ptr<PostDominatorTree>(new PostDominatorTree());
    pdtree = pdtreeptr.get();
    pdtree->runOnFunction(F); // compute post-dominator tree for this function

#else // LLVM >= 3.9

    PostDominatorTreeWrapperPass wrapper;
    wrapper.runOnFunction(F);
    pdtree = &wrapper.getPostDomTree();

#ifndef NDEBUG
    wrapper.verifyAnalysis();
#endif

    DBG(cda, "Computing post dominator frontiers and adding CD");

#if 0 // this does not work as expected
    llvm::ReverseIDFCalculator PDF(*pdtree);
    for (auto& B : F) {
        llvm::SmallPtrSet<llvm::BasicBlock *, 1> blocks;
        blocks.insert(&B);
        PDF.setDefiningBlocks(blocks);

        SmallVector<BasicBlock *, 8> pdfrontiers;
        PDF.calculate(pdfrontiers);

        // FIXME: reserve the memory
        for (auto *pdf : pdfrontiers) {
            dependencies[&B].insert(pdf);
            dependentBlocks[pdf].insert(&B);
        }
    }
#endif

    PostDominanceFrontiers PDF;

    for (auto &B : F) {
        auto *pdtreenode = pdtree->getNode(&B);
        assert(pdtreenode && "Do not have a node in post-dom tree");
        auto &pdfrontiers = PDF.calculate(*pdtree, pdtreenode);
        for (auto *pdf : pdfrontiers) {
            dependencies[&B].insert(pdf);
            dependentBlocks[pdf].insert(&B);
        }
    }

#endif // LLVM < 3.9

    DBG_SECTION_END(cda, "Done computing post dominators for function "
                                 << F.getName().str());
}